

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS
ref_smooth_node_same_tangent
          (REF_GRID ref_grid,REF_INT node,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  long lVar4;
  REF_DBL tan1 [3];
  REF_DBL tan0 [3];
  double local_68 [4];
  double local_48 [3];
  
  pRVar1 = ref_grid->node;
  *allowed = 1;
  pRVar2 = pRVar1->real;
  lVar4 = 0;
  do {
    local_48[lVar4] = pRVar2[node * 0xf + lVar4] - pRVar2[node0 * 0xf + lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pRVar2 = pRVar1->real;
  lVar4 = 0;
  do {
    local_68[lVar4] = pRVar2[node1 * 0xf + lVar4] - pRVar2[node * 0xf + lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  uVar3 = ref_math_normalize(local_48);
  if (uVar3 == 0) {
    uVar3 = ref_math_normalize(local_68);
    if (uVar3 == 0) {
      uVar3 = 0;
      if (local_48[2] * local_68[2] + local_48[0] * local_68[0] + local_48[1] * local_68[1] <
          pRVar1->same_normal_tol) {
        *allowed = 0;
        uVar3 = 0;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x2e2,"ref_smooth_node_same_tangent",(ulong)uVar3,"edge 1 zero length");
      printf("nodes %d %d %d\n",(ulong)(uint)node0,(ulong)(uint)node,(ulong)(uint)node1);
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x2e0,
           "ref_smooth_node_same_tangent",(ulong)uVar3,"edge 0 zero length");
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_node_same_tangent(REF_GRID ref_grid,
                                                       REF_INT node,
                                                       REF_INT node0,
                                                       REF_INT node1,
                                                       REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL tan0[3], tan1[3];
  REF_DBL dot;
  REF_INT i;

  *allowed = REF_TRUE;
  for (i = 0; i < 3; i++)
    tan0[i] =
        ref_node_xyz(ref_node, i, node) - ref_node_xyz(ref_node, i, node0);
  for (i = 0; i < 3; i++)
    tan1[i] =
        ref_node_xyz(ref_node, i, node1) - ref_node_xyz(ref_node, i, node);

  RSS(ref_math_normalize(tan0), "edge 0 zero length");
  RSB(ref_math_normalize(tan1), "edge 1 zero length",
      { printf("nodes %d %d %d\n", node0, node, node1); });

  dot = ref_math_dot(tan0, tan1);
  if (dot < ref_node_same_normal_tol(ref_node)) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}